

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

pair<int_*,_bool>
HighsHashTree<int,_int>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,HighsHashTableEntry<int,_int> *entry)

{
  char *pcVar1;
  byte bVar2;
  uint uVar3;
  InnerLeaf<1> *this;
  ValueType *pVVar5;
  int iVar4;
  ulong *puVar6;
  undefined8 *puVar7;
  sbyte sVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar10;
  uint uVar9;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  long lVar11;
  int i;
  long lVar12;
  ulong uVar13;
  Entry *pEVar14;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  undefined8 *puVar18;
  InnerLeaf<4> *this_00;
  BranchNode *branch;
  pair<int_*,_bool> pVar19;
  pair<int_*,_bool> pVar20;
  pair<int_*,_bool> pVar21;
  array<unsigned_char,_55UL> sizes;
  undefined8 local_70;
  byte local_68 [56];
  
  uVar13 = insertNode->ptrAndType;
  switch((uint)uVar13 & 7) {
  case 0:
    if (hashPos != 9) {
      this = (InnerLeaf<1> *)operator_new(0x78);
      (this->occupation).occupation = 0;
      this->size = 0;
      (this->hashes)._M_elems[0] = 0;
      insertNode->ptrAndType = (ulong)this | 2;
      pVar19 = InnerLeaf<1>::insert_entry(this,hash,hashPos,entry);
      return pVar19;
    }
    puVar7 = (undefined8 *)operator_new(0x18);
    *puVar7 = 0;
    *(HighsHashTableEntry<int,_int> *)(puVar7 + 1) = *entry;
    *(undefined4 *)(puVar7 + 2) = 1;
    insertNode->ptrAndType = (ulong)puVar7 | 1;
    uVar10 = extraout_RDX;
    goto LAB_002747c7;
  case 1:
    puVar7 = (undefined8 *)(uVar13 & 0xfffffffffffffff8);
    do {
      puVar18 = puVar7;
      if (*(int *)(puVar18 + 1) == entry->key_) {
        uVar10 = 0;
        goto LAB_002748db;
      }
      puVar7 = (undefined8 *)*puVar18;
    } while ((undefined8 *)*puVar18 != (undefined8 *)0x0);
    puVar7 = (undefined8 *)operator_new(0x10);
    *puVar7 = 0;
    *(HighsHashTableEntry<int,_int> *)(puVar7 + 1) = *entry;
    *puVar18 = puVar7;
    piVar15 = (int *)((undefined8 *)(uVar13 & 0xfffffffffffffff8) + 2);
    *piVar15 = *piVar15 + 1;
    uVar10 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
    puVar18 = puVar7;
LAB_002748db:
    pVar20._8_8_ = uVar10;
    pVar20.first = (int *)((long)puVar18 + 0xc);
    break;
  case 2:
    pVar20 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar13 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar20 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar13 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar20 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar13 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar13 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar19 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      return pVar19;
    }
    pVVar5 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->key_);
    if (pVVar5 != (ValueType *)0x0) {
      pVar19._8_8_ = 0;
      pVar19.first = pVVar5;
      return pVar19;
    }
    uVar3 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
    uVar13 = (this_00->occupation).occupation | 1L << (ulong)uVar3;
    lVar12 = POPCOUNT(uVar13);
    puVar6 = (ulong *)operator_new((lVar12 * 8 + 0x7fffffff8U & 0x7fffffff8) + 0x4f &
                                   0xffffffffffffffc0);
    insertNode->ptrAndType = (ulong)puVar6 | 6;
    *puVar6 = uVar13;
    iVar17 = hashPos + 1;
    uVar9 = (uint)lVar12;
    sVar8 = (sbyte)uVar3;
    if (iVar17 != 9) {
      if (uVar9 < 2) {
        insertNode = (NodePtr *)(puVar6 + 1);
        puVar6[1] = (ulong)this_00 | 5;
        InnerLeaf<4>::rehash(this_00,iVar17);
      }
      else {
        uVar3 = this_00->size;
        iVar4 = (uVar3 - uVar9) + 2;
        if (iVar4 < 7) {
          lVar11 = 0;
          local_70 = hash;
          do {
            puVar7 = (undefined8 *)operator_new(0x78);
            *puVar7 = 0;
            *(undefined4 *)(puVar7 + 1) = 0;
            puVar7[2] = 0;
            puVar6[lVar11 + 1] = (ulong)puVar7 | 2;
            lVar11 = lVar11 + 1;
          } while (lVar12 != lVar11);
          if (0 < (int)uVar3) {
            pEVar14 = (this_00->entries)._M_elems;
            lVar12 = 0;
            do {
              InnerLeaf<1>::insert_entry
                        ((InnerLeaf<1> *)
                         (puVar6[POPCOUNT(uVar13 >> ((byte)((uint)pEVar14[-0x37].key_ >> 10) & 0x3f)
                                         )] & 0xfffffffffffffff8),
                         (ulong)(uint)pEVar14->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                         0x20 ^ (ulong)(uint)pEVar14->key_ * -0x75e7c76a1153eaca +
                                0x1da24fc66dd63e32,iVar17,pEVar14);
              lVar12 = lVar12 + 1;
              pEVar14 = pEVar14 + 1;
            } while (lVar12 < this_00->size);
          }
          operator_delete(this_00);
          hash = local_70;
          pVar21 = InnerLeaf<1>::insert_entry
                             ((InnerLeaf<1> *)
                              (puVar6[POPCOUNT(uVar13 >> sVar8)] & 0xfffffffffffffff8),local_70,
                              iVar17,entry);
          iVar17 = hashPos;
        }
        else {
          local_68[0x20] = 0;
          local_68[0x21] = 0;
          local_68[0x22] = 0;
          local_68[0x23] = 0;
          local_68[0x24] = 0;
          local_68[0x25] = 0;
          local_68[0x26] = 0;
          local_68[0x27] = 0;
          local_68[0x28] = 0;
          local_68[0x29] = 0;
          local_68[0x2a] = 0;
          local_68[0x2b] = 0;
          local_68[0x2c] = 0;
          local_68[0x2d] = 0;
          local_68[0x2e] = 0;
          local_68[0x10] = 0;
          local_68[0x11] = 0;
          local_68[0x12] = 0;
          local_68[0x13] = 0;
          local_68[0x14] = 0;
          local_68[0x15] = 0;
          local_68[0x16] = 0;
          local_68[0x17] = 0;
          local_68[0x18] = 0;
          local_68[0x19] = 0;
          local_68[0x1a] = 0;
          local_68[0x1b] = 0;
          local_68[0x1c] = 0;
          local_68[0x1d] = 0;
          local_68[0x1e] = 0;
          local_68[0x1f] = 0;
          local_68[0] = 0;
          local_68[1] = 0;
          local_68[2] = 0;
          local_68[3] = 0;
          local_68[4] = 0;
          local_68[5] = 0;
          local_68[6] = 0;
          local_68[7] = 0;
          local_68[8] = 0;
          local_68[9] = 0;
          local_68[10] = 0;
          local_68[0xb] = 0;
          local_68[0xc] = 0;
          local_68[0xd] = 0;
          local_68[0xe] = 0;
          local_68[0xf] = 0;
          local_68[0x2f] = 0;
          local_68[0x30] = 0;
          local_68[0x31] = 0;
          local_68[0x32] = 0;
          local_68[0x33] = 0;
          local_68[0x34] = 0;
          local_68[0x35] = 0;
          local_68[0x36] = 0;
          pcVar1 = (char *)((long)&local_70 + POPCOUNT(uVar13 >> sVar8) + 7);
          *pcVar1 = *pcVar1 + '\x01';
          if (0 < (int)uVar3) {
            uVar16 = 0;
            do {
              pcVar1 = (char *)((long)&local_70 +
                               POPCOUNT(uVar13 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar16]
                                                         >> 10) & 0x3f)) + 7);
              *pcVar1 = *pcVar1 + '\x01';
              uVar16 = uVar16 + 1;
            } while (uVar3 != uVar16);
          }
          piVar15 = (int *)0x0;
          do {
            switch(local_68[(long)piVar15] + 9 >> 4) {
            case 0:
              puVar7 = (undefined8 *)operator_new(0x78);
              uVar16 = 2;
              break;
            case 1:
              puVar7 = (undefined8 *)operator_new(0x178);
              uVar16 = 3;
              break;
            case 2:
              puVar7 = (undefined8 *)operator_new(0x278);
              uVar16 = 4;
              break;
            case 3:
              puVar7 = (undefined8 *)operator_new(0x378);
              uVar16 = 5;
              break;
            default:
              goto switchD_00274d75_default;
            }
            *puVar7 = 0;
            *(undefined4 *)(puVar7 + 1) = 0;
            puVar7[2] = 0;
            puVar6[(long)piVar15 + 1] = uVar16 | (ulong)puVar7;
switchD_00274d75_default:
            piVar15 = (int *)((long)piVar15 + 1);
          } while ((int *)(ulong)(uVar9 + (uVar9 == 0)) != piVar15);
          if (0 < (int)uVar3) {
            pEVar14 = (this_00->entries)._M_elems;
            piVar15 = (int *)0x0;
            do {
              uVar16 = puVar6[POPCOUNT(uVar13 >> ((byte)((uint)pEVar14[-0x37].key_ >> 10) & 0x3f))];
              switch((uint)uVar16 & 7) {
              case 2:
                InnerLeaf<1>::insert_entry
                          ((InnerLeaf<1> *)(uVar16 & 0xfffffffffffffff8),
                           (ulong)(uint)pEVar14->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                           0x20 ^ (ulong)(uint)pEVar14->key_ * -0x75e7c76a1153eaca +
                                  0x1da24fc66dd63e32,iVar17,pEVar14);
                break;
              case 3:
                InnerLeaf<2>::insert_entry
                          ((InnerLeaf<2> *)(uVar16 & 0xfffffffffffffff8),
                           (ulong)(uint)pEVar14->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                           0x20 ^ (ulong)(uint)pEVar14->key_ * -0x75e7c76a1153eaca +
                                  0x1da24fc66dd63e32,iVar17,pEVar14);
                break;
              case 4:
                InnerLeaf<3>::insert_entry
                          ((InnerLeaf<3> *)(uVar16 & 0xfffffffffffffff8),
                           (ulong)(uint)pEVar14->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                           0x20 ^ (ulong)(uint)pEVar14->key_ * -0x75e7c76a1153eaca +
                                  0x1da24fc66dd63e32,iVar17,pEVar14);
                break;
              case 5:
                InnerLeaf<4>::insert_entry
                          ((InnerLeaf<4> *)(uVar16 & 0xfffffffffffffff8),
                           (ulong)(uint)pEVar14->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                           0x20 ^ (ulong)(uint)pEVar14->key_ * -0x75e7c76a1153eaca +
                                  0x1da24fc66dd63e32,iVar17,pEVar14);
              }
              piVar15 = (int *)((long)piVar15 + 1);
              pEVar14 = pEVar14 + 1;
            } while ((long)piVar15 < (long)this_00->size);
          }
          operator_delete(this_00);
          pVar21._8_8_ = extraout_RDX_03;
          pVar21.first = piVar15;
          insertNode = (NodePtr *)(puVar6 + POPCOUNT(uVar13 >> sVar8));
        }
        if (iVar4 < 7) {
          return pVar21;
        }
      }
      goto LAB_00274973;
    }
    memset(puVar6 + 1,0,(ulong)(uVar9 << 3));
    iVar17 = this_00->size;
    if (0 < iVar17) {
      lVar12 = 0;
      do {
        lVar11 = POPCOUNT(uVar13 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar12] >> 10) & 0x3f))
        ;
        if ((puVar6[lVar11] & 7) == 0) {
          puVar7 = (undefined8 *)operator_new(0x18);
          *puVar7 = 0;
          *(HighsHashTableEntry<int,_int> *)(puVar7 + 1) = (this_00->entries)._M_elems[lVar12];
          *(undefined4 *)(puVar7 + 2) = 1;
          puVar6[lVar11] = (ulong)puVar7 | 1;
        }
        else {
          puVar18 = (undefined8 *)(puVar6[lVar11] & 0xfffffffffffffff8);
          puVar7 = (undefined8 *)operator_new(0x10);
          uVar10 = puVar18[1];
          *puVar7 = *puVar18;
          puVar7[1] = uVar10;
          *puVar18 = puVar7;
          *(HighsHashTableEntry<int,_int> *)(puVar18 + 1) = (this_00->entries)._M_elems[lVar12];
          *(int *)(puVar18 + 2) = *(int *)(puVar18 + 2) + 1;
          iVar17 = this_00->size;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar17);
    }
    operator_delete(this_00);
    if ((puVar6[POPCOUNT(uVar13 >> sVar8)] & 7) == 0) {
      puVar7 = (undefined8 *)operator_new(0x18);
      *puVar7 = 0;
      *(HighsHashTableEntry<int,_int> *)(puVar7 + 1) = *entry;
      *(undefined4 *)(puVar7 + 2) = 1;
      puVar6[POPCOUNT(uVar13 >> sVar8)] = (ulong)puVar7 | 1;
      uVar10 = extraout_RDX_02;
    }
    else {
      puVar7 = (undefined8 *)(puVar6[POPCOUNT(uVar13 >> sVar8)] & 0xfffffffffffffff8);
      puVar18 = (undefined8 *)operator_new(0x10);
      uVar10 = puVar7[1];
      *puVar18 = *puVar7;
      puVar18[1] = uVar10;
      *puVar7 = puVar18;
      *(HighsHashTableEntry<int,_int> *)(puVar7 + 1) = *entry;
      *(int *)(puVar7 + 2) = *(int *)(puVar7 + 2) + 1;
      uVar10 = extraout_RDX_01;
    }
LAB_002747c7:
    pVar20._9_7_ = (int7)((ulong)uVar10 >> 8);
    pVar20.second = true;
    pVar20.first = (int *)((long)puVar7 + 0xc);
    break;
  case 6:
    uVar16 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    branch = (BranchNode *)(uVar13 & 0xfffffffffffffff8);
    uVar13 = (branch->occupation).occupation;
    bVar2 = (byte)uVar16;
    lVar12 = POPCOUNT(uVar13 >> (bVar2 & 0x3f));
    if ((uVar13 >> (uVar16 & 0x3f) & 1) == 0) {
      branch = addChildToBranchNode(branch,bVar2 & 0x3f,(int)lVar12);
      branch->child[lVar12].ptrAndType = 0;
      (branch->occupation).occupation = (branch->occupation).occupation | 1L << (bVar2 & 0x3f);
    }
    else {
      lVar12 = lVar12 + -1;
    }
    insertNode->ptrAndType = (ulong)branch | 6;
    iVar17 = hashPos + 1;
    insertNode = branch->child + lVar12;
    goto LAB_00274973;
  case 7:
    iVar17 = hashPos;
LAB_00274973:
    pVar20 = insert_recurse(insertNode,hash,iVar17,entry);
  }
  return pVar20;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }